

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

int __thiscall sf::Shader::getUniformLocation(Shader *this,string *name)

{
  GLhandleARB GVar1;
  _func_GLint_GLhandleARB_GLcharARB_ptr *p_Var2;
  bool bVar3;
  pointer ppVar4;
  char *pcVar5;
  ostream *poVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_70;
  GLint local_44;
  iterator iStack_40;
  int location;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_28;
  const_iterator it;
  string *name_local;
  Shader *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->m_uniforms,name);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  iStack_40 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::end(&this->m_uniforms);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(&local_38,&stack0xffffffffffffffc0);
  bVar3 = std::operator!=(&local_28,&local_38);
  p_Var2 = sf_ptrc_glGetUniformLocationARB;
  if (bVar3) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_28);
    this_local._4_4_ = ppVar4->second;
  }
  else {
    GVar1 = this->m_shaderProgram;
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        it._M_node);
    local_44 = (*p_Var2)(GVar1,pcVar5);
    std::make_pair<std::__cxx11::string_const&,int&>
              (&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node,
               &local_44);
    std::
    map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::insert<std::pair<std::__cxx11::string,int>>
              ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->m_uniforms,&local_70);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_70);
    if (local_44 == -1) {
      poVar6 = err();
      poVar6 = std::operator<<(poVar6,"Uniform \"");
      poVar6 = std::operator<<(poVar6,(string *)it._M_node);
      poVar6 = std::operator<<(poVar6,"\" not found in shader");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    this_local._4_4_ = local_44;
  }
  return this_local._4_4_;
}

Assistant:

int Shader::getUniformLocation(const std::string& name)
{
    // Check the cache
    UniformTable::const_iterator it = m_uniforms.find(name);
    if (it != m_uniforms.end())
    {
        // Already in cache, return it
        return it->second;
    }
    else
    {
        // Not in cache, request the location from OpenGL
        int location = GLEXT_glGetUniformLocation(castToGlHandle(m_shaderProgram), name.c_str());
        m_uniforms.insert(std::make_pair(name, location));

        if (location == -1)
            err() << "Uniform \"" << name << "\" not found in shader" << std::endl;

        return location;
    }
}